

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bigint<13> * __thiscall bigint<13>::sub<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  iVar3 = x->len;
  uVar5 = (ulong)y->len;
  bVar8 = 0 < (long)uVar5;
  if ((long)uVar5 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    do {
      uVar7 = 0;
      if (bVar8) {
        uVar7 = (uint)y->digits[uVar4];
      }
      uVar7 = (x->digits[uVar4] | 0x10000) - (uVar6 + uVar7);
      this->digits[uVar4] = (digit)uVar7;
      uVar6 = uVar7 >> 0x10 ^ 1;
      uVar4 = uVar4 + 1;
      bVar8 = uVar4 < uVar5;
    } while ((bVar8) || (uVar7 < 0x10000));
  }
  iVar1 = iVar3 - (int)uVar4;
  if (this != x && (iVar1 != 0 && (int)uVar4 <= iVar3)) {
    memcpy(this->digits + (uVar4 & 0xffffffff),x->digits + (uVar4 & 0xffffffff),(long)iVar1 * 2);
  }
  iVar3 = x->len;
  this->len = iVar3;
  if ((long)iVar3 != 0) {
    lVar2 = (long)iVar3 + 1;
    do {
      iVar3 = iVar3 + -1;
      if (this->digits[lVar2 + -2] != 0) {
        return this;
      }
      this->len = iVar3;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 1);
  }
  return this;
}

Assistant:

bigint &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        ASSERT(x >= y);
        dbldigit borrow = 0;
        int i;
        for(i = 0; i < y.len || borrow; i++)
        {
             borrow = (1<<BI_DIGIT_BITS) + (dbldigit)x.digits[i] - (i<y.len ? (dbldigit)y.digits[i] : 0) - borrow;
             digits[i] = (digit)borrow;
             borrow = (borrow>>BI_DIGIT_BITS)^1;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = x.len;
        shrink();
        return *this;
    }